

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int add_zombie_request(LIBSSH2_SFTP *sftp,uint32_t request_id)

{
  LIBSSH2_SESSION *session_00;
  list_node *entry;
  sftp_zombie_requests *zombie;
  LIBSSH2_SESSION *session;
  uint32_t request_id_local;
  LIBSSH2_SFTP *sftp_local;
  
  session_00 = sftp->channel->session;
  entry = (list_node *)(*sftp->channel->session->alloc)(0x20,&sftp->channel->session->abstract);
  if (entry == (list_node *)0x0) {
    sftp_local._4_4_ = _libssh2_error(session_00,-6,"malloc fail for zombie request ID");
  }
  else {
    *(uint32_t *)&entry[1].next = request_id;
    _libssh2_list_add(&sftp->zombie_requests,entry);
    sftp_local._4_4_ = 0;
  }
  return sftp_local._4_4_;
}

Assistant:

static int
add_zombie_request(LIBSSH2_SFTP *sftp, uint32_t request_id)
{
    LIBSSH2_SESSION *session = sftp->channel->session;

    struct sftp_zombie_requests *zombie;

    _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                   "Marking request ID %u as a zombie request", request_id));

    zombie = LIBSSH2_ALLOC(sftp->channel->session,
                           sizeof(struct sftp_zombie_requests));
    if(!zombie)
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "malloc fail for zombie request ID");
    else {
        zombie->request_id = request_id;
        _libssh2_list_add(&sftp->zombie_requests, &zombie->node);
        return LIBSSH2_ERROR_NONE;
    }
}